

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::BM_LogAndApply(int iters,int num_base_files)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Env *pEVar5;
  Comparator *c;
  uint num;
  uint num_00;
  uint num_01;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  char *in_R9;
  char local_7d8 [8];
  char buf [16];
  uint us;
  uint64_t stop_micros;
  string local_7b0;
  Slice local_790;
  undefined1 local_780 [8];
  InternalKey limit_1;
  Slice local_740;
  undefined1 local_730 [8];
  InternalKey start_1;
  VersionEdit vedit;
  int i_1;
  uint64_t start_micros;
  Message local_650;
  undefined1 local_648 [16];
  undefined1 local_638 [8];
  AssertionResult gtest_ar_2;
  Slice local_608;
  undefined1 local_5f8 [8];
  InternalKey limit;
  Slice local_5b8;
  undefined1 local_5a8 [8];
  InternalKey start;
  pointer ppFStack_580;
  int i;
  uint64_t fnum;
  VersionEdit vbase;
  Message local_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_498 [7];
  bool save_manifest;
  VersionSet vset;
  Options options;
  InternalKeyComparator cmp;
  MutexLock l;
  Mutex mu;
  Env *env;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_150;
  Message local_148;
  char local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  Status s;
  Options opts;
  DB *db;
  Status local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string dbname;
  int num_base_files_local;
  int iters_local;
  
  dbname.field_2._8_4_ = num_base_files;
  dbname.field_2._12_4_ = iters;
  testing::TempDir_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"leveldb_test_benchmark");
  std::__cxx11::string::~string((string *)&local_50);
  Options::Options((Options *)&db);
  DestroyDB((leveldb *)&local_58,(string *)local_30,(Options *)&db);
  Status::~Status(&local_58);
  opts.filter_policy = (FilterPolicy *)0x0;
  Options::Options((Options *)&s);
  opts.comparator._0_1_ = 1;
  DB::Open((DB *)&gtest_ar.message_,(Options *)&s,(string *)local_30,(DB **)&opts.filter_policy);
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_138,&local_139,
             (Status *)0x1e0819);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x8c9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message(&local_148);
  }
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  if (gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_169 = opts.filter_policy != (FilterPolicy *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_168,&local_169,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&env,(internal *)local_168,(AssertionResult *)"db != nullptr","false",
                 "true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x8ca,pcVar4);
      testing::internal::AssertHelper::operator=(&local_180,&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      std::__cxx11::string::~string((string *)&env);
      testing::Message::~Message(&local_178);
    }
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
    if (gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      if (opts.filter_policy != (FilterPolicy *)0x0) {
        (*(opts.filter_policy)->_vptr_FilterPolicy[1])();
      }
      opts.filter_policy = (FilterPolicy *)0x0;
      pEVar5 = Env::Default();
      port::Mutex::Mutex((Mutex *)&l);
      MutexLock::MutexLock((MutexLock *)&cmp.user_comparator_,(Mutex *)&l);
      c = BytewiseComparator();
      InternalKeyComparator::InternalKeyComparator
                ((InternalKeyComparator *)&options.filter_policy,c);
      Options::Options((Options *)&vset.field_0x248);
      VersionSet::VersionSet
                ((VersionSet *)local_498,(string *)local_30,(Options *)&vset.field_0x248,
                 (TableCache *)0x0,(InternalKeyComparator *)&options.filter_policy);
      test::IsOK();
      testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
      VersionSet::Recover((VersionSet *)local_4c0,(bool *)local_498);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_4b0,
                 local_4c0 + 0xf,(Status *)"vset.Recover(&save_manifest)");
      Status::~Status((Status *)local_4c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
      if (!bVar1) {
        testing::Message::Message(&local_4c8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &vbase.new_files_.
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x8d8,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &vbase.new_files_.
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4c8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &vbase.new_files_.
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_4c8);
      }
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
      if (gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        VersionEdit::VersionEdit((VersionEdit *)&fnum);
        ppFStack_580 = (pointer)0x1;
        uVar6 = extraout_RDX;
        for (start.rep_.field_2._12_4_ = 0;
            (int)start.rep_.field_2._12_4_ < (int)dbname.field_2._8_4_;
            start.rep_.field_2._12_4_ = start.rep_.field_2._12_4_ + 1) {
          MakeKey_abi_cxx11_((string *)((long)&limit.rep_.field_2 + 8),
                             (leveldb *)(((ulong)ppFStack_580 & 0x7fffffff) << 1),(uint)uVar6);
          Slice::Slice(&local_5b8,(string *)((long)&limit.rep_.field_2 + 8));
          InternalKey::InternalKey((InternalKey *)local_5a8,&local_5b8,1,kTypeValue);
          std::__cxx11::string::~string((string *)(limit.rep_.field_2._M_local_buf + 8));
          MakeKey_abi_cxx11_((string *)&gtest_ar_2.message_,
                             (leveldb *)(ulong)((int)ppFStack_580 * 2 + 1),num);
          Slice::Slice(&local_608,(string *)&gtest_ar_2.message_);
          InternalKey::InternalKey((InternalKey *)local_5f8,&local_608,1,kTypeDeletion);
          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
          VersionEdit::AddFile
                    ((VersionEdit *)&fnum,2,(uint64_t)ppFStack_580,1,(InternalKey *)local_5a8,
                     (InternalKey *)local_5f8);
          InternalKey::~InternalKey((InternalKey *)local_5f8);
          InternalKey::~InternalKey((InternalKey *)local_5a8);
          uVar6 = extraout_RDX_00;
          ppFStack_580 = (pointer)((long)ppFStack_580 + 1);
        }
        test::IsOK();
        testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
        VersionSet::LogAndApply((VersionSet *)local_648,(VersionEdit *)local_498,(Mutex *)&fnum);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_638,
                   local_648 + 0xf,(Status *)"vset.LogAndApply(&vbase, &mu)");
        Status::~Status((Status *)local_648);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
        if (!bVar1) {
          testing::Message::Message(&local_650);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&start_micros,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x8e0,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&start_micros,&local_650);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&start_micros);
          testing::Message::~Message(&local_650);
        }
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
        if (gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          iVar2 = (*pEVar5->_vptr_Env[0x15])();
          for (vedit.new_files_.
               super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              vedit.new_files_.
              super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < (int)dbname.field_2._12_4_;
              vedit.new_files_.
              super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   vedit.new_files_.
                   super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
            VersionEdit::VersionEdit((VersionEdit *)((long)&start_1.rep_.field_2 + 8));
            VersionEdit::RemoveFile
                      ((VersionEdit *)((long)&start_1.rep_.field_2 + 8),2,(uint64_t)ppFStack_580);
            MakeKey_abi_cxx11_((string *)((long)&limit_1.rep_.field_2 + 8),
                               (leveldb *)(((ulong)ppFStack_580 & 0x7fffffff) << 1),num_00);
            Slice::Slice(&local_740,(string *)((long)&limit_1.rep_.field_2 + 8));
            InternalKey::InternalKey((InternalKey *)local_730,&local_740,1,kTypeValue);
            std::__cxx11::string::~string((string *)(limit_1.rep_.field_2._M_local_buf + 8));
            MakeKey_abi_cxx11_(&local_7b0,(leveldb *)(ulong)((int)ppFStack_580 * 2 + 1),num_01);
            Slice::Slice(&local_790,&local_7b0);
            InternalKey::InternalKey((InternalKey *)local_780,&local_790,1,kTypeDeletion);
            std::__cxx11::string::~string((string *)&local_7b0);
            VersionEdit::AddFile
                      ((VersionEdit *)((long)&start_1.rep_.field_2 + 8),2,(uint64_t)ppFStack_580,1,
                       (InternalKey *)local_730,(InternalKey *)local_780);
            VersionSet::LogAndApply
                      ((VersionSet *)&stop_micros,(VersionEdit *)local_498,
                       (Mutex *)((long)&start_1.rep_.field_2 + 8));
            Status::~Status((Status *)&stop_micros);
            InternalKey::~InternalKey((InternalKey *)local_780);
            InternalKey::~InternalKey((InternalKey *)local_730);
            VersionEdit::~VersionEdit((VersionEdit *)((long)&start_1.rep_.field_2 + 8));
            ppFStack_580 = (pointer)((long)ppFStack_580 + 1);
          }
          iVar3 = (*pEVar5->_vptr_Env[0x15])();
          buf._12_4_ = iVar3 - iVar2;
          snprintf(local_7d8,0x10,"%d",(ulong)(uint)dbname.field_2._8_4_);
          fprintf(_stderr,"BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n",
                  (double)((float)(uint)buf._12_4_ / (float)(int)dbname.field_2._12_4_),local_7d8,
                  (ulong)(uint)dbname.field_2._12_4_,(ulong)(uint)buf._12_4_);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        VersionEdit::~VersionEdit((VersionEdit *)&fnum);
      }
      VersionSet::~VersionSet((VersionSet *)local_498);
      InternalKeyComparator::~InternalKeyComparator((InternalKeyComparator *)&options.filter_policy)
      ;
      MutexLock::~MutexLock((MutexLock *)&cmp.user_comparator_);
    }
  }
  Status::~Status((Status *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void BM_LogAndApply(int iters, int num_base_files) {
  std::string dbname = testing::TempDir() + "leveldb_test_benchmark";
  DestroyDB(dbname, Options());

  DB* db = nullptr;
  Options opts;
  opts.create_if_missing = true;
  Status s = DB::Open(opts, dbname, &db);
  ASSERT_LEVELDB_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;

  Env* env = Env::Default();

  port::Mutex mu;
  MutexLock l(&mu);

  InternalKeyComparator cmp(BytewiseComparator());
  Options options;
  VersionSet vset(dbname, &options, nullptr, &cmp);
  bool save_manifest;
  ASSERT_LEVELDB_OK(vset.Recover(&save_manifest));
  VersionEdit vbase;
  uint64_t fnum = 1;
  for (int i = 0; i < num_base_files; i++) {
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vbase.AddFile(2, fnum++, 1 /* file size */, start, limit);
  }
  ASSERT_LEVELDB_OK(vset.LogAndApply(&vbase, &mu));

  uint64_t start_micros = env->NowMicros();

  for (int i = 0; i < iters; i++) {
    VersionEdit vedit;
    vedit.RemoveFile(2, fnum);
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vedit.AddFile(2, fnum++, 1 /* file size */, start, limit);
    vset.LogAndApply(&vedit, &mu);
  }
  uint64_t stop_micros = env->NowMicros();
  unsigned int us = stop_micros - start_micros;
  char buf[16];
  std::snprintf(buf, sizeof(buf), "%d", num_base_files);
  std::fprintf(stderr,
               "BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n",
               buf, iters, us, ((float)us) / iters);
}